

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCborValue>::reserve(QList<QCborValue> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QCborValue> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QCborValue> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QArrayDataPointer<QCborValue> *in_stack_ffffffffffffff60;
  QArrayDataPointer<QCborValue> *in_stack_ffffffffffffff68;
  QArrayDataPointer<QCborValue> *this_01;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QCborValue> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  QArrayDataPointer<QCborValue> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QCborValue> *)0x47c3c5);
  qVar3 = QArrayDataPointer<QCborValue>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QCborValue>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QCborValue>::flags(in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_0047c5a1;
    QArrayDataPointer<QCborValue>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QCborValue>::isShared(in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QCborValue>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QCborValue>::setFlag
                ((QArrayDataPointer<QCborValue> *)0x47c47f,(ArrayOptions)in_stack_ffffffffffffff5c.i
                );
      goto LAB_0047c5a1;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QCborValue *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QCborValue> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  this_01 = &local_38;
  QArrayDataPointer<QCborValue>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)this_01 >> 0x20));
  this_00 = (QGenericArrayOps<QCborValue> *)QArrayDataPointer<QCborValue>::operator->(this_01);
  QArrayDataPointer<QCborValue>::operator->(in_RDI);
  QArrayDataPointer<QCborValue>::begin((QArrayDataPointer<QCborValue> *)0x47c501);
  QArrayDataPointer<QCborValue>::operator->(in_RDI);
  QArrayDataPointer<QCborValue>::end(in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QCborValue>::copyAppend
            (this_00,(QCborValue *)this_01,(QCborValue *)in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QCborValue>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QArrayDataPointer<QCborValue> *)QArrayDataPointer<QCborValue>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QCborValue>::setFlag
              ((QArrayDataPointer<QCborValue> *)0x47c568,(ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QCborValue>::swap
            (in_stack_ffffffffffffff60,
             (QArrayDataPointer<QCborValue> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QCborValue>::~QArrayDataPointer(in_stack_ffffffffffffff60);
LAB_0047c5a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}